

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

size_t __thiscall io_buf::bin_write_fixed(io_buf *this,char *data,size_t len)

{
  uint64_t uVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  char *p;
  undefined8 local_20;
  
  if (in_RDX != 0) {
    buf_write((io_buf *)len,(char **)p,unaff_retaddr);
    memcpy(local_20,in_RSI,in_RDX);
    if ((*(byte *)(in_RDI + 8) & 1) != 0) {
      uVar1 = uniform_hash(this,(size_t)data,len);
      *(int *)(in_RDI + 0xc) = (int)uVar1;
    }
  }
  return in_RDX;
}

Assistant:

size_t bin_write_fixed(const char* data, size_t len)
  {
    if (len > 0)
    {
      char* p;
      buf_write(p, len);

      memcpy(p, data, len);

      // compute hash for check-sum
      if (_verify_hash)
        _hash = (uint32_t)uniform_hash(p, len, _hash);
    }
    return len;
  }